

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

HighsStatus
readSolutionFile(string *filename,HighsOptions *options,HighsLp *lp,HighsBasis *basis,
                HighsSolution *solution,HighsInt style)

{
  HighsInt HVar1;
  bool bVar2;
  HighsStatus HVar3;
  iterator iVar4;
  char *format;
  long lVar5;
  int iVar6;
  size_type __new_size;
  HighsLogOptions *log_options_;
  HighsInt num_col;
  HighsInt num_row;
  HighsInt iCol;
  double value;
  HighsBasis *local_378;
  HighsSolution *local_370;
  size_type local_368;
  string keyword;
  string name;
  HighsSolution read_solution;
  string section_name;
  HighsBasis read_basis;
  ifstream in_file;
  
  log_options_ = &(options->super_HighsOptionsStruct).log_options;
  if ((style & 0xfffffffbU) != 0) {
    highsLogUser(log_options_,kError,"readSolutionFile: Cannot read file of style %d\n",
                 (ulong)(uint)style);
    return kError;
  }
  local_370 = solution;
  std::ifstream::ifstream(&in_file,(string *)filename,_S_in);
  if (((&in_file.super_basic_istream<char,_std::char_traits<char>_>.field_0x20)
       [(long)in_file.super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream[-3]] &
      5) != 0) {
    highsLogUser(log_options_,kError,"readSolutionFile: Cannot open readable file \"%s\"\n",
                 (filename->_M_dataplus)._M_p);
    HVar3 = kError;
    goto LAB_00260720;
  }
  keyword._M_dataplus._M_p = (pointer)&keyword.field_2;
  keyword._M_string_length = 0;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  keyword.field_2._M_local_buf[0] = '\0';
  name.field_2._M_local_buf[0] = '\0';
  iVar6 = lp->num_col_;
  local_368 = (size_type)lp->num_row_;
  HighsSolution::HighsSolution(&read_solution,local_370);
  HighsBasis::HighsBasis(&read_basis,basis);
  HighsSolution::clear(&read_solution);
  HighsBasis::clear(&read_basis);
  __new_size = (size_type)iVar6;
  std::vector<double,_std::allocator<double>_>::resize(&read_solution.col_value,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&read_solution.row_value,local_368);
  std::vector<double,_std::allocator<double>_>::resize(&read_solution.col_dual,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&read_solution.row_dual,local_368);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
            (&read_basis.col_status,__new_size);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
            (&read_basis.row_status,local_368);
  section_name._M_dataplus._M_p = (pointer)&section_name.field_2;
  section_name._M_string_length = 0;
  section_name.field_2._M_local_buf[0] = '\0';
  bVar2 = readSolutionFileIdIgnoreLineOk(&section_name,&in_file);
  if (bVar2) {
    bVar2 = std::operator==(&section_name,"=obj=");
    if (bVar2) {
      if ((lp->col_names_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (lp->col_names_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        highsLogUser(log_options_,kError,
                     "readSolutionFile: Cannot read a MIPLIB solution file without column names in the model\n"
                    );
        goto LAB_002606e5;
      }
      if ((lp->col_hash_).name2index._M_h._M_element_count == 0) {
        HighsNameHash::form(&lp->col_hash_,&lp->col_names_);
      }
      _iCol = 0.0;
      local_378 = basis;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                (&read_solution.col_value,__new_size,(value_type_conflict1 *)&iCol);
      do {
        bVar2 = readSolutionFileIdDoubleLineOk(&name,&value,&in_file);
        if (!bVar2) break;
        iVar4 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)&lp->col_hash_,&name);
        if (iVar4.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
            ._M_cur == (__node_type *)0x0) {
          format = "readSolutionFile: name %s is not found\n";
LAB_002606d3:
          highsLogUser(log_options_,kError,format,name._M_dataplus._M_p);
          goto LAB_002606e5;
        }
        if ((long)*(int *)((long)iVar4.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                 ._M_cur + 0x28) == -1) {
          format = "readSolutionFile: name %s is duplicated\n";
          goto LAB_002606d3;
        }
        read_solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start
        [*(int *)((long)iVar4.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                        ._M_cur + 0x28)] = value;
      } while (((&in_file.super_basic_istream<char,_std::char_traits<char>_>.field_0x20)
                [(long)in_file.super_basic_istream<char,_std::char_traits<char>_>.
                       _vptr_basic_istream[-3]] & 2) == 0);
LAB_00260566:
      read_solution.value_valid = true;
      bVar2 = readSolutionFileHashKeywordIntLineOk(&keyword,&num_row,&in_file);
      HVar1 = num_row;
      if (!bVar2) {
        HVar3 = calculateRowValuesQuad(lp,&read_solution.col_value,&read_solution.row_value,-1);
LAB_002606b5:
        if (HVar3 == kOk) {
          HVar3 = kOk;
          readSolutionFileReturn(kOk,local_370,local_378,&read_solution,&read_basis,&in_file);
          goto LAB_002606e8;
        }
        goto LAB_002606bd;
      }
      for (lVar5 = 0; lVar5 < num_row; lVar5 = lVar5 + 1) {
        bVar2 = readSolutionFileIdDoubleLineOk(&name,&value,&in_file);
        if (!bVar2) {
          std::ifstream::close();
          goto LAB_002606e5;
        }
        if (HVar1 == (int)local_368) {
          read_solution.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5] = value;
        }
      }
      if (HVar1 == (int)local_368) {
LAB_002607d3:
        bVar2 = readSolutionFileIgnoreLineOk(&in_file);
        if (((bVar2) && (bVar2 = readSolutionFileIgnoreLineOk(&in_file), bVar2)) &&
           (bVar2 = readSolutionFileIgnoreLineOk(&in_file), bVar2)) {
          bVar2 = readSolutionFileKeywordLineOk(&keyword,&in_file);
          if (!bVar2) goto LAB_00260782;
          bVar2 = std::operator!=(&keyword,"None");
          if (bVar2) {
            bVar2 = readSolutionFileIgnoreLineOk(&in_file);
            if (!bVar2) goto LAB_00260782;
            bVar2 = readSolutionFileHashKeywordIntLineOk(&keyword,&num_col,&in_file);
            if (!bVar2) goto LAB_00260b28;
            for (lVar5 = 0; lVar5 < num_col; lVar5 = lVar5 + 1) {
              bVar2 = readSolutionFileIdDoubleLineOk(&name,(double *)&iCol,&in_file);
              if (!bVar2) {
                std::ifstream::close();
                goto LAB_002606e5;
              }
              read_solution.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar5] = _iCol;
            }
            bVar2 = readSolutionFileHashKeywordIntLineOk(&keyword,&num_row,&in_file);
            if (!bVar2) {
              HVar3 = kOk;
              readSolutionFileReturn(kOk,local_370,local_378,&read_solution,&read_basis,&in_file);
              goto LAB_002606e8;
            }
            for (lVar5 = 0; lVar5 < num_row; lVar5 = lVar5 + 1) {
              bVar2 = readSolutionFileIdDoubleLineOk(&name,(double *)&iCol,&in_file);
              if (!bVar2) {
                std::ifstream::close();
                goto LAB_002606e5;
              }
              read_solution.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar5] = _iCol;
            }
          }
          bVar2 = readSolutionFileIgnoreLineOk(&in_file);
          if (((bVar2) && (bVar2 = readSolutionFileIgnoreLineOk(&in_file), bVar2)) &&
             (bVar2 = readSolutionFileIgnoreLineOk(&in_file), bVar2)) {
            HVar3 = readBasisStream(log_options_,&read_basis,&in_file);
            readSolutionFileReturn(HVar3,local_370,local_378,&read_solution,&read_basis,&in_file);
            goto LAB_002606e8;
          }
        }
LAB_00260b28:
        HVar3 = kOk;
        readSolutionFileReturn(kOk,local_370,local_378,&read_solution,&read_basis,&in_file);
        goto LAB_002606e8;
      }
      highsLogUser(log_options_,kWarning,
                   "readSolutionFile: Solution file is for %d rows, not %d: row values ignored\n");
      HVar3 = calculateRowValuesQuad(lp,&read_solution.col_value,&read_solution.row_value,-1);
      if (HVar3 == kOk) goto LAB_002607d3;
LAB_00260782:
      std::ifstream::close();
      goto LAB_002606e5;
    }
    local_378 = basis;
    bVar2 = readSolutionFileIgnoreLineOk(&in_file);
    if ((((!bVar2) || (bVar2 = readSolutionFileIgnoreLineOk(&in_file), !bVar2)) ||
        (bVar2 = readSolutionFileIgnoreLineOk(&in_file), !bVar2)) ||
       (bVar2 = readSolutionFileKeywordLineOk(&keyword,&in_file), !bVar2)) {
LAB_002606bd:
      std::ifstream::close();
      goto LAB_002606e5;
    }
    bVar2 = std::operator==(&keyword,"None");
    if (!bVar2) {
      bVar2 = readSolutionFileIgnoreLineOk(&in_file);
      if (((bVar2) && (bVar2 = readSolutionFileIgnoreLineOk(&in_file), bVar2)) &&
         (bVar2 = readSolutionFileHashKeywordIntLineOk(&keyword,&num_col,&in_file), bVar2)) {
        if (num_col < 1) {
          num_col = -num_col;
          _iCol = 0.0;
          std::vector<double,_std::allocator<double>_>::_M_fill_assign
                    (&read_solution.col_value,__new_size,(value_type_conflict1 *)&iCol);
          for (iVar6 = 0; iVar6 < num_col; iVar6 = iVar6 + 1) {
            bVar2 = readSolutionFileIdDoubleIntLineOk(&value,&iCol,&in_file);
            if (!bVar2) {
              std::ifstream::close();
              goto LAB_002606e5;
            }
            read_solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iCol] = value;
          }
          read_solution.value_valid = true;
          HVar3 = calculateRowValuesQuad(lp,&read_solution.col_value,&read_solution.row_value,-1);
          goto LAB_002606b5;
        }
        if (num_col == iVar6) {
          for (lVar5 = 0; lVar5 < iVar6; lVar5 = lVar5 + 1) {
            bVar2 = readSolutionFileIdDoubleLineOk(&name,&value,&in_file);
            if (!bVar2) {
              std::ifstream::close();
              goto LAB_002606e5;
            }
            read_solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5] = value;
            iVar6 = num_col;
          }
          goto LAB_00260566;
        }
        highsLogUser(log_options_,kError,
                     "readSolutionFile: Solution file is for %d columns, not %d\n");
      }
      goto LAB_002606bd;
    }
    std::ifstream::close();
    HVar3 = kWarning;
  }
  else {
    std::ifstream::close();
LAB_002606e5:
    HVar3 = kError;
  }
LAB_002606e8:
  std::__cxx11::string::~string((string *)&section_name);
  HighsBasis::~HighsBasis(&read_basis);
  HighsSolution::~HighsSolution(&read_solution);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&keyword);
LAB_00260720:
  std::ifstream::~ifstream(&in_file);
  return HVar3;
}

Assistant:

HighsStatus readSolutionFile(const std::string filename,
                             const HighsOptions& options, HighsLp& lp,
                             HighsBasis& basis, HighsSolution& solution,
                             const HighsInt style) {
  const HighsLogOptions& log_options = options.log_options;
  if (style != kSolutionStyleRaw && style != kSolutionStyleSparse) {
    highsLogUser(log_options, HighsLogType::kError,
                 "readSolutionFile: Cannot read file of style %d\n",
                 (int)style);
    return HighsStatus::kError;
  }
  std::ifstream in_file(filename);
  if (in_file.fail()) {
    highsLogUser(log_options, HighsLogType::kError,
                 "readSolutionFile: Cannot open readable file \"%s\"\n",
                 filename.c_str());
    return HighsStatus::kError;
  }
  std::string keyword;
  std::string name;
  double value;
  HighsInt num_col;
  HighsInt num_row;
  const HighsInt lp_num_col = lp.num_col_;
  const HighsInt lp_num_row = lp.num_row_;
  // Define identifiers for reading in
  HighsSolution read_solution = solution;
  HighsBasis read_basis = basis;
  read_solution.clear();
  read_basis.clear();
  read_solution.col_value.resize(lp_num_col);
  read_solution.row_value.resize(lp_num_row);
  read_solution.col_dual.resize(lp_num_col);
  read_solution.row_dual.resize(lp_num_row);
  read_basis.col_status.resize(lp_num_col);
  read_basis.row_status.resize(lp_num_row);
  std::string section_name;
  if (!readSolutionFileIdIgnoreLineOk(section_name, in_file))
    return readSolutionFileErrorReturn(
        in_file);  // Model (status) or =obj= (value)
  const bool miplib_sol = section_name == "=obj=";
  if (miplib_sol) {
    // A MIPLIB solution file has nonzero solution values for a subset
    // of the variables identified by name, so there must be column
    // names
    if (!lp.col_names_.size()) {
      highsLogUser(log_options, HighsLogType::kError,
                   "readSolutionFile: Cannot read a MIPLIB solution file "
                   "without column names in the model\n");
      return HighsStatus::kError;
    }
    // Ensure that the col name hash table has been formed
    if (!lp.col_hash_.name2index.size()) lp.col_hash_.form(lp.col_names_);
  }
  bool sparse = false;
  if (!miplib_sol) {
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  // Optimal
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  //
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  // # Primal solution values
    if (!readSolutionFileKeywordLineOk(keyword, in_file))
      return readSolutionFileErrorReturn(in_file);
    // Read in the primal solution values: return warning if there is none
    if (keyword == "None")
      return readSolutionFileReturn(HighsStatus::kWarning, solution, basis,
                                    read_solution, read_basis, in_file);
    // If there are primal solution values then keyword is the status
    // and the next line is objective
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  // EOL
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  // Objective
    // Next line should be "Columns" and correct number
    if (!readSolutionFileHashKeywordIntLineOk(keyword, num_col, in_file))
      return readSolutionFileErrorReturn(in_file);
    assert(keyword == "Columns");
    // The default style parameter is kSolutionStyleRaw, and this still
    // allows sparse files to be read. Recognise the latter from num_col
    // <= 0. Doesn't matter if num_col = 0, since there's nothing to
    // read either way
    sparse = num_col <= 0;
    if (style == kSolutionStyleSparse) assert(sparse);
    if (sparse) {
      num_col = -num_col;
      assert(num_col <= lp_num_col);
    } else {
      if (num_col != lp_num_col) {
        highsLogUser(log_options, HighsLogType::kError,
                     "readSolutionFile: Solution file is for %" HIGHSINT_FORMAT
                     " columns, not %" HIGHSINT_FORMAT "\n",
                     num_col, lp_num_col);
        return readSolutionFileErrorReturn(in_file);
      }
    }
  }
  if (miplib_sol) {
    HighsInt num_value = 0;
    read_solution.col_value.assign(lp_num_col, 0);
    for (;;) {
      // Only false return is for encountering EOF
      if (!readSolutionFileIdDoubleLineOk(name, value, in_file)) break;
      auto search = lp.col_hash_.name2index.find(name);
      if (search == lp.col_hash_.name2index.end()) {
        highsLogUser(log_options, HighsLogType::kError,
                     "readSolutionFile: name %s is not found\n", name.c_str());
        return HighsStatus::kError;
      } else if (search->second == kHashIsDuplicate) {
        highsLogUser(log_options, HighsLogType::kError,
                     "readSolutionFile: name %s is duplicated\n", name.c_str());
        return HighsStatus::kError;
      }
      HighsInt iCol = search->second;
      assert(lp.col_names_[iCol] == name);
      read_solution.col_value[iCol] = value;
      num_value++;
      if (in_file.eof()) break;
    }
  } else if (sparse) {
    read_solution.col_value.assign(lp_num_col, 0);
    HighsInt iCol;
    for (HighsInt iX = 0; iX < num_col; iX++) {
      if (!readSolutionFileIdDoubleIntLineOk(value, iCol, in_file))
        return readSolutionFileErrorReturn(in_file);
      read_solution.col_value[iCol] = value;
    }
  } else {
    for (HighsInt iCol = 0; iCol < num_col; iCol++) {
      if (!readSolutionFileIdDoubleLineOk(name, value, in_file))
        return readSolutionFileErrorReturn(in_file);
      read_solution.col_value[iCol] = value;
    }
  }
  read_solution.value_valid = true;
  if (sparse) {
    if (calculateRowValuesQuad(lp, read_solution.col_value,
                               read_solution.row_value) != HighsStatus::kOk)
      return readSolutionFileErrorReturn(in_file);
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis, in_file);
  }
  // Read in the col values: OK to have none, otherwise next line
  // should be "Rows" and correct number
  if (!readSolutionFileHashKeywordIntLineOk(keyword, num_row, in_file)) {
    // Compute the row values since there are none to read
    if (calculateRowValuesQuad(lp, read_solution.col_value,
                               read_solution.row_value) != HighsStatus::kOk)
      return readSolutionFileErrorReturn(in_file);
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis, in_file);
  }
  assert(keyword == "Rows");
  // OK to read from a file with different number of rows, since the
  // primal solution is all that's important. For example, see #1284,
  // where the user is solving a sequence of MIPs with the same number
  // of variables, but increasing numbers of constraints, and wants to
  // used the solution from one MIP as the starting solution for the
  // next.
  const bool num_row_ok = num_row == lp_num_row;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    if (!readSolutionFileIdDoubleLineOk(name, value, in_file))
      return readSolutionFileErrorReturn(in_file);
    if (num_row_ok) read_solution.row_value[iRow] = value;
  }
  if (!num_row_ok) {
    highsLogUser(log_options, HighsLogType::kWarning,
                 "readSolutionFile: Solution file is for %" HIGHSINT_FORMAT
                 " rows, not %" HIGHSINT_FORMAT ": row values ignored\n",
                 num_row, lp_num_row);
    // Calculate the row values
    if (calculateRowValuesQuad(lp, read_solution.col_value,
                               read_solution.row_value) != HighsStatus::kOk)
      return readSolutionFileErrorReturn(in_file);
  }
  // OK to have no EOL
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  // EOL
  // OK to have no blank line
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  //
  // OK to have no reference to dual solution values
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  // # Dual solution values
  // If there's a reference to dual solution values, there's a keyword
  // to indicate their status
  if (!readSolutionFileKeywordLineOk(keyword, in_file))
    return readSolutionFileErrorReturn(in_file);
  if (keyword != "None") {
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  // EOL
    // Next line should be "Columns" and correct number
    if (!readSolutionFileHashKeywordIntLineOk(keyword, num_col, in_file))
      return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                    read_solution, read_basis, in_file);
    assert(keyword == "Columns");
    double dual;
    for (HighsInt iCol = 0; iCol < num_col; iCol++) {
      if (!readSolutionFileIdDoubleLineOk(name, dual, in_file))
        return readSolutionFileErrorReturn(in_file);
      read_solution.col_dual[iCol] = dual;
    }
    // Read in the col values: next line should be "Rows" and correct
    // number
    if (!readSolutionFileHashKeywordIntLineOk(keyword, num_row, in_file))
      return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                    read_solution, read_basis, in_file);
    assert(keyword == "Rows");
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      if (!readSolutionFileIdDoubleLineOk(name, dual, in_file))
        return readSolutionFileErrorReturn(in_file);
      read_solution.row_dual[iRow] = dual;
    }
  }
  // OK to have no EOL
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  // EOL
  // OK to have no blank line
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  //
  // OK to have no reference to basis
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  // # Basis
  HighsStatus basis_read_status =
      readBasisStream(log_options, read_basis, in_file);
  // Return with basis read status
  return readSolutionFileReturn(basis_read_status, solution, basis,
                                read_solution, read_basis, in_file);
}